

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O2

void __thiscall
StringEqualFailure::StringEqualFailure
          (StringEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,char *expected
          ,char *actual,SimpleString *text)

{
  SimpleString *this_00;
  long lVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  SimpleString *pSVar5;
  SimpleString *actual_00;
  long lVar6;
  SimpleString printableExpected;
  SimpleString printableActual;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_00129ba8;
  TestFailure::createUserText((TestFailure *)&printableExpected,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,&printableExpected);
  SimpleString::~SimpleString(&printableExpected);
  PrintableStringFromOrNull((char *)&printableExpected);
  pSVar5 = (SimpleString *)actual;
  PrintableStringFromOrNull((char *)&printableActual);
  TestFailure::createButWasString((TestFailure *)&stack0xffffffffffffffb0,pSVar5,&printableExpected)
  ;
  SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffb0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb0);
  if (actual != (char *)0x0 && expected != (char *)0x0) {
    lVar6 = -1;
    do {
      lVar1 = lVar6 + 1;
      lVar2 = lVar6 + 1;
      lVar6 = lVar6 + 1;
    } while (actual[lVar1] == expected[lVar2]);
    pSVar5 = (SimpleString *)0x0;
    while( true ) {
      cVar3 = SimpleString::at(&printableActual,(size_t)pSVar5);
      actual_00 = pSVar5;
      cVar4 = SimpleString::at(&printableExpected,(size_t)pSVar5);
      if (cVar3 != cVar4) break;
      pSVar5 = (SimpleString *)((long)&pSVar5->buffer_ + 1);
    }
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)&stack0xffffffffffffffb0,actual_00,(size_t)&printableActual,
               (size_t)pSVar5);
    SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffb0);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb0);
  }
  SimpleString::~SimpleString(&printableActual);
  SimpleString::~SimpleString(&printableExpected);
  return;
}

Assistant:

StringEqualFailure::StringEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString printableExpected = PrintableStringFromOrNull(expected);
    SimpleString printableActual = PrintableStringFromOrNull(actual);

    message_ += createButWasString(printableExpected, printableActual);
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
            ;
        size_t failStartPrintable;
        for (failStartPrintable = 0; printableActual.at(failStartPrintable) == printableExpected.at(failStartPrintable); failStartPrintable++)
            ;
        message_ += createDifferenceAtPosString(printableActual, failStartPrintable, failStart);
    }
}